

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_instruction(instruction *inst,int format_blank_count)

{
  byte bVar1;
  double *pdVar2;
  char *pcVar3;
  vec *instructions;
  int i;
  ulong uVar4;
  double dVar5;
  
  printf("%s ",opNames[inst->op_code]);
  pdVar2 = (double *)inst->arg;
  if (pdVar2 == (double *)0x0) {
LAB_001031b5:
    putchar(10);
    return;
  }
  bVar1 = inst->op_code;
  switch(bVar1) {
  case 2:
  case 3:
    switch(*(float *)pdVar2) {
    case -NAN:
      pcVar3 = "f64";
      break;
    case -NAN:
      pcVar3 = "f32";
      break;
    case -NAN:
      pcVar3 = "i64";
      break;
    case -NAN:
      pcVar3 = "i32";
      break;
    default:
      if (*(float *)pdVar2 == -NAN) {
        putchar(10);
      }
      goto LAB_00103291;
    }
    puts(pcVar3);
LAB_00103291:
    instructions = (vec *)(pdVar2 + 1);
LAB_001032e1:
    print_instructions(instructions,format_blank_count + 2,true);
    return;
  case 4:
    switch(*(float *)pdVar2) {
    case -NAN:
      pcVar3 = "f64";
      break;
    case -NAN:
      pcVar3 = "f32";
      break;
    case -NAN:
      pcVar3 = "i64";
      break;
    case -NAN:
      pcVar3 = "i32";
      break;
    default:
      if (*(float *)pdVar2 == -NAN) {
        putchar(10);
      }
      goto LAB_001032c0;
    }
    puts(pcVar3);
LAB_001032c0:
    print_instructions((vec *)(pdVar2 + 1),format_blank_count + 2,true);
    instructions = (vec *)(pdVar2 + 0xb);
    goto LAB_001032e1;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
switchD_001030e8_caseD_5:
    if (0x16 < (byte)(bVar1 - 0x28)) {
      return;
    }
    printf("align=%u offset=%lu\n",(ulong)(uint)*(float *)pdVar2,pdVar2[1]);
    return;
  case 0xc:
  case 0xd:
  case 0x10:
switchD_001030e8_caseD_c:
    uVar4 = (ulong)(uint)*(float *)pdVar2;
    pcVar3 = "%u\n";
    goto LAB_001030f3;
  case 0xe:
    for (uVar4 = 0; uVar4 < (uint)*(float *)((long)pdVar2 + 4); uVar4 = uVar4 + 1) {
      printf("%u ",(ulong)*(uint *)((long)pdVar2[1] + uVar4 * 4));
    }
    printf("%u(default)",(ulong)(uint)*(float *)pdVar2);
    goto LAB_001031b5;
  case 0x11:
    uVar4 = (ulong)(uint)*(float *)pdVar2;
    pcVar3 = "index:%u table:0x0\n";
    goto LAB_001030f3;
  }
  switch(bVar1) {
  case 0x3f:
  case 0x40:
    puts("0x0");
    return;
  case 0x41:
    uVar4 = (ulong)(uint)*(float *)pdVar2;
    break;
  case 0x42:
    printf("%ld\n",*pdVar2);
    return;
  case 0x43:
    dVar5 = (double)*(float *)pdVar2;
    goto LAB_00103232;
  case 0x44:
    dVar5 = *pdVar2;
LAB_00103232:
    printf("%.2f\n",dVar5);
    return;
  default:
    if (bVar1 - 0x20 < 5) goto switchD_001030e8_caseD_c;
    if (bVar1 != 0xfc) goto switchD_001030e8_caseD_5;
    uVar4 = (ulong)*(byte *)pdVar2;
  }
  pcVar3 = "%d\n";
LAB_001030f3:
  printf(pcVar3,uVar4);
  return;
}

Assistant:

void print_instruction(instruction *inst, int format_blank_count) {
    printf("%s ", getOpName(inst));
    void *arg = inst->arg;
    blockArgs *blockArgs1;
    ifArgs *ifArgs1;
    brArgs *brArgs1;
    brTableArgs *brTableArgs1;
    callArgs *callArgs1;
    call_indirectArgs *callIndirectArgs1;
    memArgs *memArgs1;
    if (NULL != arg) {
        switch (inst->op_code) {
            case Block:
            case Loop:
                blockArgs1 = (blockArgs *) arg;
                switch (((blockArgs *) arg)->blockType) {
                    case -1:
                        printf("i32\n");
                        break;
                    case -2:
                        printf("i64\n");
                        break;
                    case -3:
                        printf("f32\n");
                        break;
                    case -4:
                        printf("f64\n");
                        break;
                    case -64:
                        printf("\n");
                        break;
                    default:
                        break;
                }
                print_instructions(&blockArgs1->instructions, format_blank_count + 2, true);
                break;
            case If:
                ifArgs1 = (ifArgs *) arg;
                switch (((blockArgs *) arg)->blockType) {
                    case -1:
                        printf("i32\n");
                        break;
                    case -2:
                        printf("i64\n");
                        break;
                    case -3:
                        printf("f32\n");
                        break;
                    case -4:
                        printf("f64\n");
                        break;
                    case -64:
                        printf("\n");
                        break;
                    default:
                        break;
                }
                print_instructions(&ifArgs1->instructions1, format_blank_count + 2, true);
                print_instructions(&ifArgs1->instructions2, format_blank_count + 2, true);
                break;
            case Br:
            case BrIf:
                brArgs1 = (brArgs *) arg;
                printf("%u\n", *brArgs1);
                break;
            case BrTable:
                brTableArgs1 = (brTableArgs *) arg;
                for (int i = 0; i < brTableArgs1->labelCount; ++i) {
                    printf("%u ", *(brTableArgs1->labels + i));
                }
                printf("%u(default)", brTableArgs1->defaultLabels);
                printf("\n");
                break;
            case Call:
                callArgs1 = (callArgs *) arg;
                printf("%u\n", *callArgs1);
                break;
            case CallIndirect:
                callIndirectArgs1 = (call_indirectArgs *) arg;
                printf("index:%u table:0x0\n", callIndirectArgs1->t_index);
                break;
            case LocalGet:
            case LocalSet:
            case LocalTee:
            case GlobalGet:
            case GlobalSet:
                printf("%u\n", *(uint32 *) arg);
                break;
            case MemorySize:
            case MemoryGrow:
                printf("0x0\n");
                break;
            case I32Const:
                printf("%d\n", *(int32 *) arg);
                break;
            case I64Const:
                printf("%ld\n", *(int64 *) arg);
                break;
            case F32Const:
                printf("%.2f\n", *(float32 *) arg);
                break;
            case F64Const:
                printf("%.2f\n", *(float64 *) arg);
                break;
            case TruncSat:
                printf("%d\n", *(truncSatArgs *) arg);
                break;
            default:
                if (I32Load <= inst->op_code && inst->op_code <= I64Store32) {
                    memArgs1 = (memArgs *) arg;
                    printf("align=%u offset=%lu\n", memArgs1->align, memArgs1->offset);
                    break;
                }
        }
    } else {
        printf("\n");
    }
}